

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O1

bool __thiscall ConditionalExecution::testOpRead(ConditionalExecution *this,Varnode *vn,PcodeOp *op)

{
  OpCode OVar1;
  pointer ppVVar2;
  Varnode *pVVar3;
  PcodeOp *pPVar4;
  byte bVar5;
  TypeOp *pTVar6;
  PcodeOp *local_10;
  
  if (op->parent == this->iblock) {
    bVar5 = 1;
  }
  else {
    if ((((op->opcode->opcode == CPUI_RETURN) && (this->directsplit == false)) &&
        (ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
        1 < (int)((ulong)((long)(op->inrefs).
                                super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3))) &&
       (ppVVar2[1] == vn)) {
      pTVar6 = vn->def->opcode;
      OVar1 = pTVar6->opcode;
      if (OVar1 == CPUI_COPY) {
        pVVar3 = *(vn->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (((pVVar3->flags & 0x10) == 0) ||
           ((pPVar4 = pVVar3->def, pPVar4->parent == this->iblock &&
            (pPVar4->opcode->opcode != CPUI_MULTIEQUAL)))) {
          pTVar6 = (TypeOp *)0x0;
        }
        else {
          local_10 = op;
          std::vector<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(&this->returnop,&local_10);
          pTVar6 = (TypeOp *)0x1;
        }
      }
      bVar5 = (byte)pTVar6;
      if (OVar1 == CPUI_COPY) goto LAB_002f5ab8;
    }
    bVar5 = 0;
  }
LAB_002f5ab8:
  return (bool)(bVar5 & 1);
}

Assistant:

bool ConditionalExecution::testOpRead(Varnode *vn,PcodeOp *op)

{
  if (op->getParent() == iblock) return true;
  if ((op->code() == CPUI_RETURN)&&(!directsplit)) {
    if ((op->numInput() < 2)||(op->getIn(1) != vn)) return false; // Only test for flow thru to return value
    PcodeOp *copyop = vn->getDef();
    if (copyop->code() == CPUI_COPY) {
      // Ordinarily, if -vn- is produced by a COPY we want to return false here because the propagation
      // hasn't had time to happen here.  But if the flow is into a RETURN this can't propagate, so
      // we allow this as a read that can be altered.  (We have to move the COPY)
      Varnode *invn = copyop->getIn(0);
      if (!invn->isWritten()) return false;
      PcodeOp *upop = invn->getDef();
      if ((upop->getParent() == iblock)&&(upop->code() != CPUI_MULTIEQUAL))
	return false;
      returnop.push_back(op);
      return true;
    }
  }
  return false;
}